

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageNextXrCreateSpatialAnchorStoreConnectionMSFT
                   (XrSession session,XrSpatialAnchorStoreConnectionMSFT *spatialAnchorStore)

{
  unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_> uVar1;
  XrResult XVar2;
  pointer pGVar3;
  uint64_t uVar4;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar5;
  bad_alloc *anon_var_0;
  unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_> handle_info
  ;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  XrResult result;
  XrSpatialAnchorStoreConnectionMSFT *spatialAnchorStore_local;
  XrSession session_local;
  
  pVar5 = HandleInfo<XrSession_T_*>::getWithInstanceInfo(&g_session_info,session);
  handle_info._M_t.
  super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>.
  _M_t.
  super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
  .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl =
       (__uniq_ptr_data<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>,_true,_true>
        )pVar5.second;
  XVar2 = (*(*(XrGeneratedDispatchTable **)
              ((long)handle_info._M_t.
                     super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
                     .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl + 8))->
            CreateSpatialAnchorStoreConnectionMSFT)(session,spatialAnchorStore);
  if ((XVar2 == XR_SUCCESS) && (spatialAnchorStore != (XrSpatialAnchorStoreConnectionMSFT *)0x0)) {
    pGVar3 = (pointer)operator_new(0x18);
    pGVar3->instance_info = (GenValidUsageXrInstanceInfo *)0x0;
    *(undefined8 *)&pGVar3->direct_parent_type = 0;
    pGVar3->direct_parent_handle = 0;
    std::unique_ptr<GenValidUsageXrHandleInfo,std::default_delete<GenValidUsageXrHandleInfo>>::
    unique_ptr<std::default_delete<GenValidUsageXrHandleInfo>,void>
              ((unique_ptr<GenValidUsageXrHandleInfo,std::default_delete<GenValidUsageXrHandleInfo>>
                *)&anon_var_0,pGVar3);
    uVar1 = handle_info;
    pGVar3 = std::
             unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
             ::operator->((unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
                           *)&anon_var_0);
    pGVar3->instance_info =
         (GenValidUsageXrInstanceInfo *)
         uVar1._M_t.
         super___uniq_ptr_impl<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
         ._M_t.
         super__Tuple_impl<0UL,_GenValidUsageXrHandleInfo_*,_std::default_delete<GenValidUsageXrHandleInfo>_>
         .super__Head_base<0UL,_GenValidUsageXrHandleInfo_*,_false>._M_head_impl;
    pGVar3 = std::
             unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
             ::operator->((unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
                           *)&anon_var_0);
    pGVar3->direct_parent_type = XR_OBJECT_TYPE_SESSION;
    uVar4 = MakeHandleGeneric<XrSession_T*>(session);
    pGVar3 = std::
             unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
             ::operator->((unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
                           *)&anon_var_0);
    pGVar3->direct_parent_handle = uVar4;
    HandleInfoBase<XrSpatialAnchorStoreConnectionMSFT_T_*,_GenValidUsageXrHandleInfo>::insert
              (&g_spatialanchorstoreconnectionmsft_info.
                super_HandleInfoBase<XrSpatialAnchorStoreConnectionMSFT_T_*,_GenValidUsageXrHandleInfo>
               ,*spatialAnchorStore,
               (unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
                *)&anon_var_0);
    std::unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>::
    ~unique_ptr((unique_ptr<GenValidUsageXrHandleInfo,_std::default_delete<GenValidUsageXrHandleInfo>_>
                 *)&anon_var_0);
  }
  return XVar2;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrCreateSpatialAnchorStoreConnectionMSFT(
    XrSession session,
    XrSpatialAnchorStoreConnectionMSFT* spatialAnchorStore) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->CreateSpatialAnchorStoreConnectionMSFT(session, spatialAnchorStore);
        if (XR_SUCCESS == result && nullptr != spatialAnchorStore) {
            std::unique_ptr<GenValidUsageXrHandleInfo> handle_info(new GenValidUsageXrHandleInfo());
            handle_info->instance_info = gen_instance_info;
            handle_info->direct_parent_type = XR_OBJECT_TYPE_SESSION;
            handle_info->direct_parent_handle = MakeHandleGeneric(session);
            g_spatialanchorstoreconnectionmsft_info.insert(*spatialAnchorStore, std::move(handle_info));
        }
    } catch (std::bad_alloc&) {
        result = XR_ERROR_OUT_OF_MEMORY;
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}